

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# still_picture_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5e1996::StillPicturePresenceTest::SetUp(StillPicturePresenceTest *this)

{
  long in_RDI;
  aom_rational timebase;
  TestMode in_stack_000000bc;
  EncoderTest *in_stack_000000c0;
  
  libaom_test::EncoderTest::InitializeConfig(in_stack_000000c0,in_stack_000000bc);
  *(undefined8 *)(in_RDI + 0x58) = 0x1e00000001;
  *(undefined4 *)(in_RDI + 0x90) = 3;
  *(undefined4 *)(in_RDI + 0x34) = 1;
  *(undefined4 *)(in_RDI + 0x104) = *(undefined4 *)(in_RDI + 0x3fc);
  *(undefined4 *)(in_RDI + 0x44) = 1;
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    const aom_rational timebase = { 1, 30 };
    cfg_.g_timebase = timebase;
    cfg_.rc_end_usage = AOM_Q;
    cfg_.g_threads = 1;
    cfg_.full_still_picture_hdr = enable_full_header_;
    cfg_.g_limit = 1;
  }